

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O1

OPJ_BOOL opj_encode(opj_codec_t *p_info,opj_stream_t *p_stream)

{
  OPJ_BOOL OVar1;
  
  if ((p_stream == (opj_stream_t *)0x0 || p_info == (opj_codec_t *)0x0) ||
     (*(int *)(p_info + 0x12) != 0)) {
    OVar1 = 0;
  }
  else {
    OVar1 = (*(code *)p_info[1])(p_info[0xb],p_stream,p_info + 0xc);
  }
  return OVar1;
}

Assistant:

OPJ_BOOL OPJ_CALLCONV opj_encode(opj_codec_t *p_info, opj_stream_t *p_stream)
{
    if (p_info && p_stream) {
        opj_codec_private_t * l_codec = (opj_codec_private_t *) p_info;
        opj_stream_private_t * l_stream = (opj_stream_private_t *) p_stream;

        if (! l_codec->is_decompressor) {
            return l_codec->m_codec_data.m_compression.opj_encode(l_codec->m_codec,
                    l_stream,
                    &(l_codec->m_event_mgr));
        }
    }

    return OPJ_FALSE;

}